

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_transfer(AMQP_VALUE value,TRANSFER_HANDLE *transfer_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  TRANSFER_HANDLE pTVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  handle handle;
  uint local_3c;
  amqp_binary local_38;
  
  pTVar4 = (TRANSFER_HANDLE)malloc(8);
  if (pTVar4 == (TRANSFER_HANDLE)0x0) {
    *transfer_handle = (TRANSFER_HANDLE)0x0;
    iVar3 = 0x1b05;
  }
  else {
    pTVar4->composite_value = (AMQP_VALUE)0x0;
    *transfer_handle = pTVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      transfer_destroy(*transfer_handle);
      iVar3 = 0x1b0d;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_3c);
      iVar3 = 0x1b14;
      if (iVar1 == 0) {
        if (local_3c == 0) {
          iVar3 = 0x1b41;
        }
        else {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            transfer_destroy(*transfer_handle);
            iVar3 = 0x1b23;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar6);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar6);
              transfer_destroy(*transfer_handle);
              iVar3 = 0x1b2d;
            }
            else {
              iVar3 = amqpvalue_get_uint(pAVar6,(uint32_t *)&local_38);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar6);
                if (1 < local_3c) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,1);
                  if (pAVar6 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar6);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar3 = amqpvalue_get_uint(pAVar6,(uint32_t *)&local_38), iVar3 != 0)) {
                      amqpvalue_destroy(pAVar6);
                      transfer_destroy(*transfer_handle);
                      return 0x1b59;
                    }
                    amqpvalue_destroy(pAVar6);
                  }
                  if (2 < local_3c) {
                    pAVar6 = amqpvalue_get_list_item(pAVar5,2);
                    if (pAVar6 != (AMQP_VALUE)0x0) {
                      AVar2 = amqpvalue_get_type(pAVar6);
                      if ((AVar2 != AMQP_TYPE_NULL) &&
                         (iVar3 = amqpvalue_get_binary(pAVar6,&local_38), iVar3 != 0)) {
                        amqpvalue_destroy(pAVar6);
                        transfer_destroy(*transfer_handle);
                        return 0x1b76;
                      }
                      amqpvalue_destroy(pAVar6);
                    }
                    if (3 < local_3c) {
                      pAVar6 = amqpvalue_get_list_item(pAVar5,3);
                      if (pAVar6 != (AMQP_VALUE)0x0) {
                        AVar2 = amqpvalue_get_type(pAVar6);
                        if ((AVar2 != AMQP_TYPE_NULL) &&
                           (iVar3 = amqpvalue_get_uint(pAVar6,(uint32_t *)&local_38), iVar3 != 0)) {
                          amqpvalue_destroy(pAVar6);
                          transfer_destroy(*transfer_handle);
                          return 0x1b93;
                        }
                        amqpvalue_destroy(pAVar6);
                      }
                      if (4 < local_3c) {
                        pAVar6 = amqpvalue_get_list_item(pAVar5,4);
                        if (pAVar6 != (AMQP_VALUE)0x0) {
                          AVar2 = amqpvalue_get_type(pAVar6);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar3 = amqpvalue_get_boolean(pAVar6,(_Bool *)&local_38), iVar3 != 0))
                          {
                            amqpvalue_destroy(pAVar6);
                            transfer_destroy(*transfer_handle);
                            return 0x1bb0;
                          }
                          amqpvalue_destroy(pAVar6);
                        }
                        if (5 < local_3c) {
                          pAVar6 = amqpvalue_get_list_item(pAVar5,5);
                          if (pAVar6 != (AMQP_VALUE)0x0) {
                            AVar2 = amqpvalue_get_type(pAVar6);
                            if ((AVar2 != AMQP_TYPE_NULL) &&
                               (iVar3 = amqpvalue_get_boolean(pAVar6,(_Bool *)&local_38), iVar3 != 0
                               )) {
                              amqpvalue_destroy(pAVar6);
                              transfer_destroy(*transfer_handle);
                              return 0x1bcd;
                            }
                            amqpvalue_destroy(pAVar6);
                          }
                          if (6 < local_3c) {
                            pAVar6 = amqpvalue_get_list_item(pAVar5,6);
                            if (pAVar6 != (AMQP_VALUE)0x0) {
                              AVar2 = amqpvalue_get_type(pAVar6);
                              if ((AVar2 != AMQP_TYPE_NULL) &&
                                 (iVar3 = amqpvalue_get_ubyte(pAVar6,(uchar *)&local_38), iVar3 != 0
                                 )) {
                                amqpvalue_destroy(pAVar6);
                                transfer_destroy(*transfer_handle);
                                return 0x1bea;
                              }
                              amqpvalue_destroy(pAVar6);
                            }
                            if (7 < local_3c) {
                              pAVar6 = amqpvalue_get_list_item(pAVar5,7);
                              if (pAVar6 != (AMQP_VALUE)0x0) {
                                amqpvalue_destroy(pAVar6);
                              }
                              if (8 < local_3c) {
                                pAVar6 = amqpvalue_get_list_item(pAVar5,8);
                                if (pAVar6 != (AMQP_VALUE)0x0) {
                                  AVar2 = amqpvalue_get_type(pAVar6);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar3 = amqpvalue_get_boolean(pAVar6,(_Bool *)&local_38),
                                     iVar3 != 0)) {
                                    amqpvalue_destroy(pAVar6);
                                    transfer_destroy(*transfer_handle);
                                    return 0x1c14;
                                  }
                                  amqpvalue_destroy(pAVar6);
                                }
                                if (9 < local_3c) {
                                  pAVar6 = amqpvalue_get_list_item(pAVar5,9);
                                  if (pAVar6 != (AMQP_VALUE)0x0) {
                                    AVar2 = amqpvalue_get_type(pAVar6);
                                    if ((AVar2 != AMQP_TYPE_NULL) &&
                                       (iVar3 = amqpvalue_get_boolean(pAVar6,(_Bool *)&local_38),
                                       iVar3 != 0)) {
                                      amqpvalue_destroy(pAVar6);
                                      transfer_destroy(*transfer_handle);
                                      return 0x1c31;
                                    }
                                    amqpvalue_destroy(pAVar6);
                                  }
                                  if ((10 < local_3c) &&
                                     (pAVar5 = amqpvalue_get_list_item(pAVar5,10),
                                     pAVar5 != (AMQP_VALUE)0x0)) {
                                    AVar2 = amqpvalue_get_type(pAVar5);
                                    if ((AVar2 != AMQP_TYPE_NULL) &&
                                       (iVar3 = amqpvalue_get_boolean(pAVar5,(_Bool *)&local_38),
                                       iVar3 != 0)) {
                                      amqpvalue_destroy(pAVar5);
                                      transfer_destroy(*transfer_handle);
                                      return 0x1c4e;
                                    }
                                    amqpvalue_destroy(pAVar5);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                pAVar5 = amqpvalue_clone(value);
                pTVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(pAVar6);
                transfer_destroy(*transfer_handle);
                iVar3 = 0x1b37;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_transfer(AMQP_VALUE value, TRANSFER_HANDLE* transfer_handle)
{
    int result;
    TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer_create_internal();
    *transfer_handle = transfer_instance;
    if (*transfer_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            transfer_destroy(*transfer_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* handle */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                transfer_destroy(*transfer_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                transfer_destroy(*transfer_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* delivery-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                delivery_number delivery_id;
                                if (amqpvalue_get_delivery_number(item_value, &delivery_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* delivery-tag */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                delivery_tag delivery_tag;
                                if (amqpvalue_get_delivery_tag(item_value, &delivery_tag) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* message-format */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                message_format message_format;
                                if (amqpvalue_get_message_format(item_value, &message_format) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* settled */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool settled;
                                if (amqpvalue_get_boolean(item_value, &settled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* more */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool more;
                                if (amqpvalue_get_boolean(item_value, &more) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* rcv-settle-mode */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                receiver_settle_mode rcv_settle_mode;
                                if (amqpvalue_get_receiver_settle_mode(item_value, &rcv_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* state */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* resume */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool resume;
                                if (amqpvalue_get_boolean(item_value, &resume) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* aborted */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool aborted;
                                if (amqpvalue_get_boolean(item_value, &aborted) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* batchable */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool batchable;
                                if (amqpvalue_get_boolean(item_value, &batchable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    transfer_destroy(*transfer_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    transfer_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}